

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappedio.c
# Opt level: O0

int prvTidyinitFileSource(TidyAllocator *allocator,TidyInputSource *inp,FILE *fp)

{
  int __fd;
  int iVar1;
  void *pvVar2;
  undefined1 local_c0 [4];
  int fd;
  stat sbuf;
  MappedFileSource *fin;
  FILE *fp_local;
  TidyInputSource *inp_local;
  TidyAllocator *allocator_local;
  
  sbuf.__glibc_reserved[2] = (__syscall_slong_t)(*allocator->vtbl->alloc)(allocator,0x20);
  if ((void *)sbuf.__glibc_reserved[2] == (void *)0x0) {
    allocator_local._4_4_ = -1;
  }
  else {
    __fd = fileno((FILE *)fp);
    iVar1 = fstat(__fd,(stat *)local_c0);
    if ((iVar1 != -1) && (sbuf.st_rdev != 0)) {
      *(__dev_t *)(sbuf.__glibc_reserved[2] + 0x18) = sbuf.st_rdev;
      pvVar2 = mmap((void *)0x0,sbuf.st_rdev,1,1,__fd,0);
      *(void **)(sbuf.__glibc_reserved[2] + 8) = pvVar2;
      if (pvVar2 != (void *)0xffffffffffffffff) {
        *(undefined8 *)(sbuf.__glibc_reserved[2] + 0x10) = 0;
        *(TidyAllocator **)sbuf.__glibc_reserved[2] = allocator;
        fclose((FILE *)fp);
        inp->getByte = mapped_getByte;
        inp->eof = mapped_eof;
        inp->ungetByte = mapped_ungetByte;
        inp->sourceData = (void *)sbuf.__glibc_reserved[2];
        return 0;
      }
    }
    (*allocator->vtbl->free)(allocator,(void *)sbuf.__glibc_reserved[2]);
    allocator_local._4_4_ = prvTidyinitStdIOFileSource(allocator,inp,fp);
  }
  return allocator_local._4_4_;
}

Assistant:

int TY_(initFileSource)( TidyAllocator *allocator, TidyInputSource* inp, FILE* fp )
{
    MappedFileSource* fin;
    struct stat sbuf;
    int fd;

    fin = (MappedFileSource*) TidyAlloc( allocator, sizeof(MappedFileSource) );
    if ( !fin )
        return -1;

    fd = fileno(fp);
    if ( fstat(fd, &sbuf) == -1
         || sbuf.st_size == 0
         || (fin->base = mmap(0, fin->size = sbuf.st_size, PROT_READ,
                              MAP_SHARED, fd, 0)) == MAP_FAILED)
    {
        TidyFree( allocator, fin );
        /* Fallback on standard I/O */
        return TY_(initStdIOFileSource)( allocator, inp, fp );
    }

    fin->pos = 0;
    fin->allocator = allocator;
    fclose(fp);

    inp->getByte    = mapped_getByte;
    inp->eof        = mapped_eof;
    inp->ungetByte  = mapped_ungetByte;
    inp->sourceData = fin;

    return 0;
}